

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O1

BOOL fetch_next_token(Token *t)

{
  anon_union_8_7_0ba269be_for_u aVar1;
  unsigned_long uVar2;
  BOOL BVar3;
  Token temp;
  Token temp2;
  Token local_58;
  Token local_38;
  
  uVar2 = fetch_next_token::saved_token.lineno;
  if (fetch_next_token::saved_token.type != TOK_EMPTY) {
    t->filename = fetch_next_token::saved_token.filename;
    t->lineno = uVar2;
    aVar1 = fetch_next_token::saved_token.u;
    *(ulong *)t = CONCAT44(fetch_next_token::saved_token._4_4_,fetch_next_token::saved_token.type);
    t->u = aVar1;
    fetch_next_token::saved_token.type = TOK_EMPTY;
    return TRUE;
  }
  BVar3 = raw_fetch_next_token(t);
  if (BVar3 == FALSE) {
    return FALSE;
  }
  if (t->type != TOK_LEFT_PAREN) {
    return TRUE;
  }
  BVar3 = raw_fetch_next_token(&fetch_next_token::saved_token);
  if (BVar3 == FALSE) {
    return TRUE;
  }
  if (fetch_next_token::saved_token.type != TOK_INCLUDE) {
    return TRUE;
  }
  fetch_next_token::saved_token.type = TOK_EMPTY;
  BVar3 = raw_fetch_next_token(&local_58);
  if (BVar3 == FALSE) {
    fatal_input_error("include directive is missing filename!\n");
  }
  if (local_58.type != TOK_IDENTIFIER) {
    if (local_58.type == TOK_QUOTED_STRING) goto LAB_00105b96;
    fatal_input_error("Filename for include must be in \"\" quotes.\n");
  }
  input_error("Filename for include must be in \"\" quotes.\n");
LAB_00105b96:
  raw_fetch_next_token(&local_38);
  if (local_38.type != TOK_RIGHT_PAREN) {
    fatal_input_error("Too many arguments to include directive.\n");
  }
  open_file(local_58.u.string,include_dirs);
  BVar3 = fetch_next_token(t);
  return BVar3;
}

Assistant:

BOOL
fetch_next_token (Token *t)
{
  static Token saved_token = { TOK_EMPTY };
  Token temp, temp2;

  if (saved_token.type != TOK_EMPTY)
    {
      *t = saved_token;
      saved_token.type = TOK_EMPTY;
      return YES;
    }

  /* Read in the next token.  If it's not an open paren, pass it on. */
  if (!raw_fetch_next_token (t))
    return NO;
  if (t->type != TOK_LEFT_PAREN)
    return YES;

  /* Check to see if this is an #include directive. */
  if (!raw_fetch_next_token (&saved_token))
    return YES;

  if (saved_token.type != TOK_INCLUDE)
    return YES;
  saved_token.type = TOK_EMPTY;
  
  if (!raw_fetch_next_token (&temp))
    {
      fatal_input_error ("include directive is missing filename!\n");
    }
  
  if (temp.type != TOK_QUOTED_STRING)
    {
      /* Punt unless it's an identifier; if it is, include the file anyway. */
      if (temp.type != TOK_IDENTIFIER)
	{
	  fatal_input_error ("Filename for include must be in \"\" quotes.\n");
	}
      input_error ("Filename for include must be in \"\" quotes.\n");
    }

  raw_fetch_next_token (&temp2);  /* Eat the close paren. */
  if (temp2.type != TOK_RIGHT_PAREN)
    {
      fatal_input_error ("Too many arguments to include directive.\n");
    }
  open_file (temp.u.string, include_dirs);
  return fetch_next_token (t);
}